

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_auth(connectdata *conn,char *mech,char *initresp,size_t len,pop3state state1,
                          pop3state state2)

{
  size_t sVar1;
  pop3_conn *pop3c;
  CURLcode result;
  pop3state state2_local;
  pop3state state1_local;
  size_t len_local;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if ((initresp == (char *)0x0) || (sVar1 = strlen(mech), 0xff < sVar1 + 8 + len)) {
    pop3c._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s",mech);
    if (pop3c._4_4_ == CURLE_OK) {
      state(conn,state1);
    }
  }
  else {
    pop3c._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s %s",mech,initresp);
    if (pop3c._4_4_ == CURLE_OK) {
      state(conn,state2);
    }
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_perform_auth(struct connectdata *conn,
                                  const char *mech,
                                  const char *initresp, size_t len,
                                  pop3state state1, pop3state state2)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if(initresp && 8 + strlen(mech) + len <= 255) { /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s %s", mech, initresp);

    if(!result)
      state(conn, state2);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s", mech);

    if(!result)
      state(conn, state1);
  }

  return result;
}